

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonLabelCompare(JsonNode *pNode,char *zKey,u32 nKey)

{
  int iVar1;
  u32 nKey_local;
  char *zKey_local;
  JsonNode *pNode_local;
  
  if ((pNode->jnFlags & 1) == 0) {
    if (pNode->n == nKey + 2) {
      iVar1 = strncmp((char *)&((pNode->u).pPatch)->jnFlags,zKey,(ulong)nKey);
      pNode_local._4_4_ = (uint)(iVar1 == 0);
    }
    else {
      pNode_local._4_4_ = 0;
    }
  }
  else if (pNode->n == nKey) {
    iVar1 = strncmp((pNode->u).zJContent,zKey,(ulong)nKey);
    pNode_local._4_4_ = (uint)(iVar1 == 0);
  }
  else {
    pNode_local._4_4_ = 0;
  }
  return pNode_local._4_4_;
}

Assistant:

static int jsonLabelCompare(JsonNode *pNode, const char *zKey, u32 nKey){
  if( pNode->jnFlags & JNODE_RAW ){
    if( pNode->n!=nKey ) return 0;
    return strncmp(pNode->u.zJContent, zKey, nKey)==0;
  }else{
    if( pNode->n!=nKey+2 ) return 0;
    return strncmp(pNode->u.zJContent+1, zKey, nKey)==0;
  }
}